

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_definition.cpp
# Opt level: O0

void duckdb::InnerGetListOfDependencies
               (ParsedExpression *expr,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *dependencies)

{
  ExpressionType EVar1;
  BaseExpression *in_RDI;
  string *name;
  ColumnRefExpression columnref;
  ColumnRefExpression *in_stack_ffffffffffffff40;
  ColumnRefExpression *in_stack_ffffffffffffff48;
  ColumnRefExpression *in_stack_ffffffffffffff50;
  function<void_(duckdb::ParsedExpression_&)> *in_stack_ffffffffffffff78;
  BaseExpression *in_stack_ffffffffffffff80;
  ColumnRefExpression CStack_60;
  
  EVar1 = BaseExpression::GetExpressionType(in_RDI);
  if (EVar1 == COLUMN_REF) {
    BaseExpression::Cast<duckdb::ColumnRefExpression>(in_stack_ffffffffffffff80);
    in_stack_ffffffffffffff48 = &CStack_60;
    ColumnRefExpression::ColumnRefExpression(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff50 =
         (ColumnRefExpression *)ColumnRefExpression::GetColumnName((ColumnRefExpression *)0x2a19b31)
    ;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff50,(value_type *)in_stack_ffffffffffffff48);
    ColumnRefExpression::~ColumnRefExpression(in_stack_ffffffffffffff40);
  }
  ::std::function<void_(duckdb::ParsedExpression_&)>::
  function<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_lnkuiper[P]duckdb_src_parser_column_definition_cpp:143:52),_void>
            ((function<void_(duckdb::ParsedExpression_&)> *)in_stack_ffffffffffffff50,
             (anon_class_16_2_f5631f6d *)in_stack_ffffffffffffff48);
  ParsedExpressionIterator::EnumerateChildren
            ((ParsedExpression *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  ::std::function<void_(duckdb::ParsedExpression_&)>::~function
            ((function<void_(duckdb::ParsedExpression_&)> *)0x2a19bc8);
  return;
}

Assistant:

static void InnerGetListOfDependencies(ParsedExpression &expr, vector<string> &dependencies) {
	if (expr.GetExpressionType() == ExpressionType::COLUMN_REF) {
		auto columnref = expr.Cast<ColumnRefExpression>();
		auto &name = columnref.GetColumnName();
		dependencies.push_back(name);
	}
	ParsedExpressionIterator::EnumerateChildren(expr, [&](const ParsedExpression &child) {
		if (expr.GetExpressionType() == ExpressionType::LAMBDA) {
			throw NotImplementedException("Lambda functions are currently not supported in generated columns.");
		}
		InnerGetListOfDependencies((ParsedExpression &)child, dependencies);
	});
}